

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O0

bool __thiscall QPngHandler::supportsOption(QPngHandler *this,ImageOption option)

{
  undefined1 local_d;
  ImageOption option_local;
  QPngHandler *this_local;
  
  local_d = true;
  if ((((option != Gamma) && (local_d = true, option != Description)) &&
      (local_d = true, option != ImageFormat)) &&
     ((local_d = true, option != Quality && (local_d = true, option != CompressionRatio)))) {
    local_d = option == Size;
  }
  return local_d;
}

Assistant:

bool QPngHandler::supportsOption(ImageOption option) const
{
    return option == Gamma
        || option == Description
        || option == ImageFormat
        || option == Quality
        || option == CompressionRatio
        || option == Size;
}